

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorProto::Clear(DescriptorProto *this)

{
  void **ppvVar1;
  uint uVar2;
  Rep *pRVar3;
  undefined8 *puVar4;
  string *psVar5;
  long lVar6;
  long lVar7;
  
  lVar7 = (long)(this->field_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->field_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar6;
      lVar6 = lVar6 + 1;
      FieldDescriptorProto::Clear((FieldDescriptorProto *)*ppvVar1);
    } while (lVar7 != lVar6);
    (this->field_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar7 = (long)(this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->nested_type_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar6;
      lVar6 = lVar6 + 1;
      Clear((DescriptorProto *)*ppvVar1);
    } while (lVar7 != lVar6);
    (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar7 = (long)(this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar6;
      lVar6 = lVar6 + 1;
      EnumDescriptorProto::Clear((EnumDescriptorProto *)*ppvVar1);
    } while (lVar7 != lVar6);
    (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar7 = (long)(this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->extension_range_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar6;
      lVar6 = lVar6 + 1;
      DescriptorProto_ExtensionRange::Clear((DescriptorProto_ExtensionRange *)*ppvVar1);
    } while (lVar7 != lVar6);
    (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar7 = (long)(this->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar6;
      lVar6 = lVar6 + 1;
      FieldDescriptorProto::Clear((FieldDescriptorProto *)*ppvVar1);
    } while (lVar7 != lVar6);
    (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar7 = (long)(this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar6;
      lVar6 = lVar6 + 1;
      OneofDescriptorProto::Clear((OneofDescriptorProto *)*ppvVar1);
    } while (lVar7 != lVar6);
    (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar7 = (long)(this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      ppvVar1 = pRVar3->elements + lVar6;
      lVar6 = lVar6 + 1;
      DescriptorProto_ReservedRange::Clear((DescriptorProto_ReservedRange *)*ppvVar1);
    } while (lVar7 != lVar6);
    (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  lVar7 = (long)(this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar7) {
    pRVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      puVar4 = (undefined8 *)pRVar3->elements[lVar6];
      lVar6 = lVar6 + 1;
      puVar4[1] = 0;
      *(undefined1 *)*puVar4 = 0;
    } while (lVar7 != lVar6);
    (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 3) != 0) {
    if ((uVar2 & 1) != 0) {
      psVar5 = (this->name_).ptr_;
      psVar5->_M_string_length = 0;
      *(psVar5->_M_dataplus)._M_p = '\0';
    }
    if ((uVar2 & 2) != 0) {
      MessageOptions::Clear(this->options_);
    }
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void DescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.DescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  field_.Clear();
  nested_type_.Clear();
  enum_type_.Clear();
  extension_range_.Clear();
  extension_.Clear();
  oneof_decl_.Clear();
  reserved_range_.Clear();
  reserved_name_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      GOOGLE_DCHECK(options_ != nullptr);
      options_->Clear();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}